

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86::forward(InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined4 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  Mat *in_stack_00000160;
  Mat *in_stack_00000168;
  Mat *in_stack_00000170;
  Mat *in_stack_00000230;
  int in_stack_0000023c;
  Mat *in_stack_00000240;
  Mat *in_stack_00000248;
  Mat *in_stack_00000250;
  Mat *in_stack_00000258;
  Option *in_stack_000020d0;
  Mat *in_stack_000020d8;
  Mat *in_stack_000020e0;
  InnerProduct_x86 *in_stack_000020e8;
  Option *in_stack_00004580;
  Option *in_stack_0000bd50;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  undefined8 in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  void *local_118;
  int *local_110;
  long *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  int local_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_c0;
  int local_bc;
  long *local_b0;
  int local_94;
  void **local_90;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  long *local_60;
  void **local_58;
  long *local_50;
  void **local_40;
  void *local_38;
  long *local_28;
  void **local_20;
  long *local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  if (((*(byte *)((long)in_RCX + 0x1e) & 1) != 0) && (*(int *)(in_RDI + 0xdc) != 0)) {
    iVar1 = forward_int8_x86(in_stack_000020e8,in_stack_000020e0,in_stack_000020d8,in_stack_000020d0
                            );
    return iVar1;
  }
  local_bc = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
  local_b0 = in_RDX;
  if (((int)in_RSI[5] == 2) && (*(int *)((long)in_RSI + 0x2c) == local_bc)) {
    local_c0 = (undefined4)in_RSI[6];
    local_c8 = in_RSI[2];
    local_cc = (undefined4)in_RSI[3];
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),iVar1,
                (Allocator *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    local_50 = local_b0;
    bVar2 = true;
    if (*local_b0 != 0) {
      local_28 = local_b0;
      bVar2 = local_b0[8] * (long)(int)local_b0[7] == 0;
    }
    if (!bVar2) {
      innerproduct_gemm_sse
                (in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240,
                 in_stack_0000023c,in_stack_00000230,in_stack_0000bd50);
      return 0;
    }
    return -100;
  }
  local_40 = &local_118;
  local_118 = (void *)*in_RSI;
  local_110 = (int *)in_RSI[1];
  local_f8 = (long *)in_RSI[4];
  local_f0 = (undefined4)in_RSI[5];
  local_ec = *(undefined4 *)((long)in_RSI + 0x2c);
  local_e8 = (undefined4)in_RSI[6];
  local_e4 = *(undefined4 *)((long)in_RSI + 0x34);
  local_e0 = (int)in_RSI[7];
  local_d8 = in_RSI[8];
  if (local_110 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_110;
    *local_110 = *local_110 + 1;
    UNLOCK();
  }
  local_8 = local_40;
  if ((int)in_RSI[5] != 1) {
    local_158 = *in_RCX;
    uStack_154 = in_RCX[1];
    local_148 = in_RCX[4];
    uStack_144 = in_RCX[5];
    uStack_140 = in_RCX[6];
    uStack_13c = in_RCX[7];
    local_138 = in_RCX[8];
    uStack_134 = in_RCX[9];
    uStack_130 = in_RCX[10];
    uStack_12c = in_RCX[0xb];
    local_128 = in_RCX[0xc];
    uStack_124 = in_RCX[0xd];
    uStack_120 = in_RCX[0xe];
    uStack_11c = in_RCX[0xf];
    uStack_150 = *(undefined8 *)(in_RCX + 4);
    (**(code **)(**(long **)(in_RDI + 0x250) + 0x38))
              (*(long **)(in_RDI + 0x250),in_RSI,&local_118,&local_158);
    local_58 = &local_118;
    if (local_118 != (void *)0x0) {
      local_20 = local_58;
    }
    if (local_118 == (void *)0x0 || local_d8 * local_e0 == 0) {
      local_94 = -100;
      goto LAB_00a9430b;
    }
    in_stack_fffffffffffffe47 = 0;
  }
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
              in_stack_fffffffffffffe3c,
              CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),iVar1,
              (Allocator *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  local_60 = local_b0;
  bVar2 = true;
  if (*local_b0 != 0) {
    local_18 = local_b0;
    bVar2 = local_b0[8] * (long)(int)local_b0[7] == 0;
  }
  if (bVar2) {
    local_94 = -100;
  }
  else {
    innerproduct_sse(in_stack_00000170,in_stack_00000168,in_stack_00000160,(Mat *)this,
                     bottom_blob._4_4_,top_blob,in_stack_00004580);
    local_94 = 0;
  }
LAB_00a9430b:
  local_90 = &local_118;
  if (local_110 != (int *)0x0) {
    local_6c = 0xffffffff;
    LOCK();
    local_70 = *local_110;
    *local_110 = *local_110 + -1;
    UNLOCK();
    if (local_70 == 1) {
      local_68 = local_90;
      if (local_f8 == (long *)0x0) {
        local_38 = local_118;
        if (local_118 != (void *)0x0) {
          free(local_118);
        }
      }
      else {
        (**(code **)(*local_f8 + 0x18))(local_f8,local_118);
      }
    }
  }
  return local_94;
}

Assistant:

int InnerProduct_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}